

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O2

int DataManager::getLinkIndex(char *name,int *index,Network *nw)

{
  int iVar1;
  string local_48;
  allocator local_21;
  
  std::__cxx11::string::string((string *)&local_48,name,&local_21);
  iVar1 = Network::indexOf(nw,LINK,&local_48);
  *index = iVar1;
  std::__cxx11::string::~string((string *)&local_48);
  return *index >> 0x1f & 0xcd;
}

Assistant:

int DataManager::getLinkIndex(char* name, int* index, Network* nw)
{
    *index = nw->indexOf(Element::LINK, name);
    if ( *index < 0 ) return 205;
    return 0;
}